

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isURIString(XMLCh *uricString)

{
  short *psVar1;
  bool bVar2;
  XMLCh theChar;
  int iVar3;
  long lVar4;
  
  if (uricString == (XMLCh *)0x0) {
    return false;
  }
  theChar = *uricString;
  if (theChar == L'\0') {
LAB_00254acb:
    bVar2 = false;
  }
  else {
    do {
      bVar2 = XMLString::isAlphaNum(theChar);
      lVar4 = 2;
      if ((!bVar2) &&
         (iVar3 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,theChar), iVar3 == -1)) {
        if (*uricString != L'%') goto LAB_00254acb;
        lVar4 = 2;
        do {
          psVar1 = (short *)((long)uricString + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar1 != 0);
        if ((0xfffffffffffffffc < (lVar4 >> 1) - 4U) ||
           (bVar2 = XMLString::isHex(uricString[1]), !bVar2)) goto LAB_00254acb;
        bVar2 = XMLString::isHex(uricString[2]);
        lVar4 = 6;
        if (!bVar2) goto LAB_00254acb;
      }
      theChar = *(XMLCh *)((long)uricString + lVar4);
      uricString = (XMLCh *)((long)uricString + lVar4);
    } while (theChar != L'\0');
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool XMLUri::isURIString(const XMLCh* const uricString)
{
	if (!uricString || !*uricString)
        return false;

    const XMLCh* tmpStr = uricString;

    while (*tmpStr)
    {
        if (isReservedOrUnreservedCharacter(*tmpStr))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >=3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    return true;
}